

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileSet.cxx
# Opt level: O2

cmFileSetVisibility cmFileSetVisibilityFromName(string_view name,cmMakefile *mf)

{
  bool bVar1;
  cmFileSetVisibility cVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  string msg;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  __y._M_str = "INTERFACE";
  __y._M_len = 9;
  bVar1 = std::operator==(name,__y);
  if (bVar1) {
    cVar2 = Interface;
  }
  else {
    __y_00._M_str = "PUBLIC";
    __y_00._M_len = 6;
    bVar1 = std::operator==(name,__y_00);
    if (bVar1) {
      cVar2 = Public;
    }
    else {
      __y_01._M_str = "PRIVATE";
      __y_01._M_len = 7;
      bVar1 = std::operator==(name,__y_01);
      cVar2 = Private;
      if (!bVar1) {
        local_50.View_._M_len = 0x15;
        local_50.View_._M_str = "File set visibility \"";
        local_80.View_._M_len = name._M_len;
        local_80.View_._M_str = name._M_str;
        cmStrCat<char[16]>(&msg,&local_50,&local_80,(char (*) [16])"\" is not valid.");
        if (mf == (cmMakefile *)0x0) {
          cmSystemTools::Error(&msg);
        }
        else {
          cmMakefile::IssueMessage(mf,FATAL_ERROR,&msg);
        }
        std::__cxx11::string::~string((string *)&msg);
      }
    }
  }
  return cVar2;
}

Assistant:

cmFileSetVisibility cmFileSetVisibilityFromName(cm::string_view name,
                                                cmMakefile* mf)
{
  if (name == "INTERFACE"_s) {
    return cmFileSetVisibility::Interface;
  }
  if (name == "PUBLIC"_s) {
    return cmFileSetVisibility::Public;
  }
  if (name == "PRIVATE"_s) {
    return cmFileSetVisibility::Private;
  }
  auto msg = cmStrCat("File set visibility \"", name, "\" is not valid.");
  if (mf) {
    mf->IssueMessage(MessageType::FATAL_ERROR, msg);
  } else {
    cmSystemTools::Error(msg);
  }
  return cmFileSetVisibility::Private;
}